

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O2

semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
* __thiscall
burst::
make_semiintersect_iterator<std::initializer_list<int>const,std::initializer_list<int>const,std::initializer_list<int>const,int>
          (semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,
          tuple<const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>
          *ranges,int min_items)

{
  _Vector_base<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
  local_80;
  iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  local_68;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  
  local_28 = *(undefined8 *)(this + 0x10);
  local_38 = *(undefined4 *)this;
  uStack_34 = *(undefined4 *)(this + 4);
  uStack_30 = *(undefined4 *)(this + 8);
  uStack_2c = *(undefined4 *)(this + 0xc);
  detail::
  apply_impl<burst::make_range_vector_t_const&,std::tuple<std::initializer_list<int>const&,std::initializer_list<int>const&,std::initializer_list<int>const&>&,0ul,1ul,2ul>
            (&local_80,(detail *)&make_range_vector);
  own_as_range_t::operator()
            ((iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>_>
              *)&local_68,(own_as_range_t *)&own_as_range,
             (vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
              *)&local_80);
  make_semiintersect_iterator<boost::iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>>,int>
            (__return_storage_ptr__,(burst *)&local_68,
             (iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>_>
              *)((ulong)ranges & 0xffffffff),min_items);
  boost::iterator_range_detail::
  iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  ::~iterator_range_base(&local_68);
  std::
  _Vector_base<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
  ::~_Vector_base(&local_80);
  return __return_storage_ptr__;
}

Assistant:

auto make_semiintersect_iterator (std::tuple<Ranges &...> ranges, Integral min_items)
    {
        auto common_ranges = detail::uniform_range_tuple_please(ranges);
        return
            make_semiintersect_iterator
            (
                burst::own_as_range(burst::apply(burst::make_range_vector, common_ranges)),
                min_items
            );
    }